

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::SyncWritePattern(SscWriterGeneric *this,bool finalStep)

{
  int iVar1;
  int iVar2;
  int iVar3;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  Buffer localBuffer;
  Buffer globalBuffer;
  string local_60;
  string local_40 [32];
  
  std::__cxx11::string::string((string *)&local_60,"Engine",&local_a1);
  std::__cxx11::string::string((string *)&localBuffer,"SscWriter",&local_a2);
  std::__cxx11::string::string((string *)&globalBuffer,"SyncWritePattern",&local_a3);
  std::__cxx11::string::string(local_40,"",&local_a4);
  iVar2 = (this->super_SscWriterBase).m_WriterRank;
  iVar1 = (this->super_SscWriterBase).m_Verbosity;
  iVar3 = 0;
  if (9 < iVar1) {
    iVar3 = iVar2;
  }
  adios2::helper::Log((string *)&local_60,(string *)&localBuffer,(string *)&globalBuffer,local_40,
                      iVar3,iVar2,5,iVar1,INFO);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&globalBuffer);
  std::__cxx11::string::~string((string *)&localBuffer);
  std::__cxx11::string::~string((string *)&local_60);
  localBuffer.m_Buffer = (uint8_t *)malloc(8);
  localBuffer.m_Capacity = 8;
  localBuffer.m_Size = 0;
  localBuffer.m_Buffer[0] = '\b';
  localBuffer.m_Buffer[1] = '\0';
  localBuffer.m_Buffer[2] = '\0';
  localBuffer.m_Buffer[3] = '\0';
  localBuffer.m_Buffer[4] = '\0';
  localBuffer.m_Buffer[5] = '\0';
  localBuffer.m_Buffer[6] = '\0';
  localBuffer.m_Buffer[7] = '\0';
  iVar2 = (this->super_SscWriterBase).m_WriterRank;
  if (iVar2 == 0) {
    SerializeStructDefinitions
              ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                *)(*(long *)(this->super_SscWriterBase).m_IO + 0x20),&localBuffer);
    iVar2 = (this->super_SscWriterBase).m_WriterRank;
  }
  if (iVar2 == (this->super_SscWriterBase).m_WriterSize + -1) {
    SerializeAttributes((this->super_SscWriterBase).m_IO,&localBuffer);
  }
  iVar2 = (this->super_SscWriterBase).m_StreamRank;
  SerializeVariables((this->m_GlobalWritePattern).
                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar2,&localBuffer,iVar2);
  globalBuffer.m_Buffer = (uint8_t *)malloc(1);
  globalBuffer.m_Capacity = 1;
  globalBuffer.m_Size = 0;
  AggregateMetadata(&localBuffer,&globalBuffer,(this->super_SscWriterBase).m_WriterComm,finalStep,
                    this->m_WriterDefinitionsLocked);
  BroadcastMetadata(&globalBuffer,(this->super_SscWriterBase).m_WriterMasterStreamRank,
                    (this->super_SscWriterBase).m_StreamComm);
  Deserialize(&globalBuffer,&this->m_GlobalWritePattern,(this->super_SscWriterBase).m_IO,false,false
              ,false,&this->m_StructDefinitions);
  if ((0x13 < (this->super_SscWriterBase).m_Verbosity) &&
     ((this->super_SscWriterBase).m_WriterRank == 0)) {
    std::__cxx11::string::string((string *)&local_60,"Global Write Pattern",(allocator *)local_40);
    PrintBlockVecVec(&this->m_GlobalWritePattern,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  free(globalBuffer.m_Buffer);
  free(localBuffer.m_Buffer);
  return;
}

Assistant:

void SscWriterGeneric::SyncWritePattern(bool finalStep)
{

    helper::Log("Engine", "SscWriter", "SyncWritePattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer localBuffer(8);
    localBuffer.value<uint64_t>() = 8;

    if (m_WriterRank == 0)
    {
        ssc::SerializeStructDefinitions(m_IO.m_ADIOS.m_StructDefinitions, localBuffer);
    }

    if (m_WriterRank == m_WriterSize - 1)
    {
        ssc::SerializeAttributes(m_IO, localBuffer);
    }

    ssc::SerializeVariables(m_GlobalWritePattern[m_StreamRank], localBuffer, m_StreamRank);

    ssc::Buffer globalBuffer;

    ssc::AggregateMetadata(localBuffer, globalBuffer, m_WriterComm, finalStep,
                           m_WriterDefinitionsLocked);

    ssc::BroadcastMetadata(globalBuffer, m_WriterMasterStreamRank, m_StreamComm);

    ssc::Deserialize(globalBuffer, m_GlobalWritePattern, m_IO, false, false, false,
                     m_StructDefinitions);

    if (m_Verbosity >= 20 && m_WriterRank == 0)
    {
        ssc::PrintBlockVecVec(m_GlobalWritePattern, "Global Write Pattern");
    }
}